

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

lyd_node * moveto_get_root(lyd_node *cur_node,int options,lyxp_node_type *root_type)

{
  lyd_node *local_30;
  lyd_node *root;
  lyxp_node_type *root_type_local;
  int options_local;
  lyd_node *cur_node_local;
  
  if (cur_node == (lyd_node *)0x0) {
    cur_node_local = (lyd_node *)0x0;
  }
  else {
    local_30 = cur_node;
    if (options == 0) {
      for (; local_30->parent != (lyd_node *)0x0; local_30 = local_30->parent) {
      }
      while (local_30->prev->next != (lyd_node *)0x0) {
        local_30 = local_30->prev;
      }
      *root_type = LYXP_NODE_ROOT;
      cur_node_local = local_30;
    }
    else {
      if ((cur_node->schema->flags & 1) == 0) {
        *root_type = LYXP_NODE_ROOT;
      }
      else {
        *root_type = LYXP_NODE_ROOT_CONFIG;
      }
      for (; local_30->parent != (lyd_node *)0x0; local_30 = local_30->parent) {
      }
      while (local_30->prev->next != (lyd_node *)0x0) {
        local_30 = local_30->prev;
      }
      cur_node_local = local_30;
    }
  }
  return cur_node_local;
}

Assistant:

static const struct lyd_node *
moveto_get_root(const struct lyd_node *cur_node, int options, enum lyxp_node_type *root_type)
{
    const struct lyd_node *root;

    if (!cur_node) {
        return NULL;
    }

    if (!options) {
        /* special kind of root that can access everything */
        for (root = cur_node; root->parent; root = root->parent);
        for (; root->prev->next; root = root->prev);
        *root_type = LYXP_NODE_ROOT;
        return root;
    }

    if (cur_node->schema->flags & LYS_CONFIG_W) {
        *root_type = LYXP_NODE_ROOT_CONFIG;
    } else {
        *root_type = LYXP_NODE_ROOT;
    }

    for (root = cur_node; root->parent; root = root->parent);
    for (; root->prev->next; root = root->prev);

    return root;
}